

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlschemastypes(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  uint uVar33;
  int test_ret;
  
  if (quiet == 0) {
    printf("Testing xmlschemastypes : 26 of 34 functions ...\n");
  }
  iVar1 = test_xmlSchemaCheckFacet();
  iVar2 = test_xmlSchemaCleanupTypes();
  iVar3 = test_xmlSchemaCollapseString();
  iVar4 = test_xmlSchemaCompareValues();
  iVar5 = test_xmlSchemaCompareValuesWhtsp();
  iVar6 = test_xmlSchemaCopyValue();
  iVar7 = test_xmlSchemaGetBuiltInListSimpleTypeItemType();
  iVar8 = test_xmlSchemaGetBuiltInType();
  iVar9 = test_xmlSchemaGetCanonValue();
  iVar10 = test_xmlSchemaGetCanonValueWhtsp();
  iVar11 = test_xmlSchemaGetFacetValueAsULong();
  iVar12 = test_xmlSchemaGetPredefinedType();
  iVar13 = test_xmlSchemaGetValType();
  iVar14 = test_xmlSchemaInitTypes();
  iVar15 = test_xmlSchemaIsBuiltInTypeFacet();
  iVar16 = test_xmlSchemaNewFacet();
  iVar17 = test_xmlSchemaNewNOTATIONValue();
  iVar18 = test_xmlSchemaNewQNameValue();
  iVar19 = test_xmlSchemaNewStringValue();
  iVar20 = test_xmlSchemaValPredefTypeNode();
  iVar21 = test_xmlSchemaValPredefTypeNodeNoNorm();
  iVar22 = test_xmlSchemaValidateFacet();
  iVar23 = test_xmlSchemaValidateFacetWhtsp();
  iVar24 = test_xmlSchemaValidateLengthFacet();
  iVar25 = test_xmlSchemaValidateLengthFacetWhtsp();
  iVar26 = test_xmlSchemaValidateListSimpleTypeFacet();
  iVar27 = test_xmlSchemaValidatePredefinedType();
  iVar28 = test_xmlSchemaValueAppend();
  iVar29 = test_xmlSchemaValueGetAsBoolean();
  iVar30 = test_xmlSchemaValueGetAsString();
  iVar31 = test_xmlSchemaValueGetNext();
  iVar32 = test_xmlSchemaWhiteSpaceReplace();
  uVar33 = iVar32 + iVar31 + iVar30 + iVar29 + iVar28 + iVar27 + iVar26 + iVar25 + iVar24 + iVar23 +
                                                                                            iVar22 +
                                                                                            iVar21 +
                                                                                            iVar20 +
                                                                                            iVar19 +
                                                                                            iVar18 +
                                                                                            iVar17 +
                                                                                            iVar16 +
                                                                                            iVar15 +
                                                                                            iVar14 +
                                                                                            iVar13 +
                                                                                            iVar12 +
                                                                                            iVar11 +
                                                                                            iVar10 +
                                                                                            iVar9 + 
                                                  iVar8 + iVar7 + iVar6 + iVar5 + iVar4 + iVar3 + 
                                                  iVar2 + iVar1;
  if (uVar33 != 0) {
    printf("Module xmlschemastypes: %d errors\n",(ulong)uVar33);
  }
  return uVar33;
}

Assistant:

static int
test_xmlschemastypes(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing xmlschemastypes : 26 of 34 functions ...\n");
    test_ret += test_xmlSchemaCheckFacet();
    test_ret += test_xmlSchemaCleanupTypes();
    test_ret += test_xmlSchemaCollapseString();
    test_ret += test_xmlSchemaCompareValues();
    test_ret += test_xmlSchemaCompareValuesWhtsp();
    test_ret += test_xmlSchemaCopyValue();
    test_ret += test_xmlSchemaGetBuiltInListSimpleTypeItemType();
    test_ret += test_xmlSchemaGetBuiltInType();
    test_ret += test_xmlSchemaGetCanonValue();
    test_ret += test_xmlSchemaGetCanonValueWhtsp();
    test_ret += test_xmlSchemaGetFacetValueAsULong();
    test_ret += test_xmlSchemaGetPredefinedType();
    test_ret += test_xmlSchemaGetValType();
    test_ret += test_xmlSchemaInitTypes();
    test_ret += test_xmlSchemaIsBuiltInTypeFacet();
    test_ret += test_xmlSchemaNewFacet();
    test_ret += test_xmlSchemaNewNOTATIONValue();
    test_ret += test_xmlSchemaNewQNameValue();
    test_ret += test_xmlSchemaNewStringValue();
    test_ret += test_xmlSchemaValPredefTypeNode();
    test_ret += test_xmlSchemaValPredefTypeNodeNoNorm();
    test_ret += test_xmlSchemaValidateFacet();
    test_ret += test_xmlSchemaValidateFacetWhtsp();
    test_ret += test_xmlSchemaValidateLengthFacet();
    test_ret += test_xmlSchemaValidateLengthFacetWhtsp();
    test_ret += test_xmlSchemaValidateListSimpleTypeFacet();
    test_ret += test_xmlSchemaValidatePredefinedType();
    test_ret += test_xmlSchemaValueAppend();
    test_ret += test_xmlSchemaValueGetAsBoolean();
    test_ret += test_xmlSchemaValueGetAsString();
    test_ret += test_xmlSchemaValueGetNext();
    test_ret += test_xmlSchemaWhiteSpaceReplace();

    if (test_ret != 0)
	printf("Module xmlschemastypes: %d errors\n", test_ret);
    return(test_ret);
}